

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpfaketransmitter.cpp
# Opt level: O0

int __thiscall
jrtplib::RTPFakeTransmitter::AddToAcceptList(RTPFakeTransmitter *this,RTPAddress *addr)

{
  uint16_t port;
  AddressType AVar1;
  uint32_t ip;
  RTPIPv4Address *address;
  int status;
  RTPAddress *addr_local;
  RTPFakeTransmitter *this_local;
  
  if ((this->init & 1U) == 0) {
    this_local._4_4_ = -0x84;
  }
  else if ((this->created & 1U) == 0) {
    this_local._4_4_ = -0x83;
  }
  else {
    AVar1 = RTPAddress::GetAddressType(addr);
    if (AVar1 == IPv4Address) {
      if (this->receivemode == AcceptSome) {
        ip = RTPIPv4Address::GetIP((RTPIPv4Address *)addr);
        port = RTPIPv4Address::GetPort((RTPIPv4Address *)addr);
        this_local._4_4_ = ProcessAddAcceptIgnoreEntry(this,ip,port);
      }
      else {
        this_local._4_4_ = -0x7c;
      }
    }
    else {
      this_local._4_4_ = -0x7e;
    }
  }
  return this_local._4_4_;
}

Assistant:

int RTPFakeTransmitter::AddToAcceptList(const RTPAddress &addr)
{
	if (!init)
		return ERR_RTP_FAKETRANS_NOTINIT;
	
	MAINMUTEX_LOCK
	
	int status;
	
	if (!created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_FAKETRANS_NOTCREATED;
	}
	if (addr.GetAddressType() != RTPAddress::IPv4Address)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_FAKETRANS_INVALIDADDRESSTYPE;
	}
	if (receivemode != RTPTransmitter::AcceptSome)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_FAKETRANS_DIFFERENTRECEIVEMODE;
	}
	
	const RTPIPv4Address &address = (const RTPIPv4Address &)addr;
	status = ProcessAddAcceptIgnoreEntry(address.GetIP(),address.GetPort());

	MAINMUTEX_UNLOCK
	return status;
}